

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# factory.cxx
# Opt level: O2

void __thiscall Fl_File_Input_Type::ideal_size(Fl_File_Input_Type *this,int *w,int *h)

{
  Fl_Widget *pFVar1;
  int iVar2;
  int iVar3;
  double extraout_XMM0_Qa;
  
  pFVar1 = (this->super_Fl_Widget_Type).o;
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x36])
            (fl_graphics_driver,(ulong)*(uint *)((long)&pFVar1[1].label_.image + 4),
             (ulong)*(uint *)&pFVar1[1].label_.deimage);
  iVar2 = (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x3a])();
  *h = iVar2 + *(int *)&pFVar1[1].label_.deimage + 4;
  iVar2 = Fl::box_dw((uint)((this->super_Fl_Widget_Type).o)->box_);
  *w = *w - iVar2;
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x38])(fl_graphics_driver,0x6d);
  iVar3 = *w + (int)extraout_XMM0_Qa + -1;
  iVar2 = Fl::box_dw((uint)((this->super_Fl_Widget_Type).o)->box_);
  iVar2 = iVar2 + (iVar3 - iVar3 % (int)extraout_XMM0_Qa);
  *w = iVar2;
  if (*h < 0x14) {
    *h = 0x14;
    iVar2 = *w;
  }
  if (iVar2 < 0x32) {
    *w = 0x32;
  }
  return;
}

Assistant:

virtual void ideal_size(int &w, int &h) {
    Fl_File_Input *myo = (Fl_File_Input *)o;
    fl_font(myo->textfont(), myo->textsize());
    h = fl_height() + myo->textsize() + 4;
    w -= Fl::box_dw(o->box());
    int ww = (int)fl_width('m');
    w = ((w + ww - 1) / ww) * ww + Fl::box_dw(o->box());
    if (h < 20) h = 20;
    if (w < 50) w = 50;
  }